

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::InputFile::InputFile
          (InputFile *this,char *filename,ContextInitializer *ctxtinit,int numThreads)

{
  MultiPartInputFile *__ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  MultiPartInputFile *this_00;
  InputPartData *pIVar2;
  
  Context::Context(&this->_ctxt);
  (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xe8);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e3610;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[2]._M_use_count = 0;
  p_Var1[2]._M_weak_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(InputFile **)&p_Var1[3]._M_use_count = this;
  *(int *)&p_Var1[4]._vptr__Sp_counted_base = numThreads;
  p_Var1[9]._M_use_count = 0;
  p_Var1[10]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[4]._M_use_count = 0;
  p_Var1[4]._M_weak_count = 0;
  p_Var1[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[5]._M_use_count = 0;
  p_Var1[5]._M_weak_count = 0;
  p_Var1[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[6]._M_use_count = 0;
  p_Var1[6]._M_weak_count = 0;
  p_Var1[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[7]._M_use_count = 0;
  p_Var1[7]._M_weak_count = 0;
  p_Var1[8]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[8]._M_use_count = 0;
  p_Var1[8]._M_weak_count = 0;
  *(_Atomic_word **)&p_Var1[10]._M_use_count = &p_Var1[9]._M_use_count;
  p_Var1[0xb]._vptr__Sp_counted_base = (_func_int **)&p_Var1[9]._M_use_count;
  p_Var1[0xb]._M_use_count = 0;
  p_Var1[0xb]._M_weak_count = 0;
  *(undefined4 *)&p_Var1[0xc]._vptr__Sp_counted_base = 0xffffffff;
  *(undefined4 *)((long)&p_Var1[0xe]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)((long)&p_Var1[0xd]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)&p_Var1[0xd]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var1[0xc]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)&p_Var1[0xc]._M_weak_count = 0;
  (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var1;
  (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  this_00 = (MultiPartInputFile *)operator_new(0x20);
  MultiPartInputFile::MultiPartInputFile(this_00,filename,ctxtinit,numThreads,false);
  p_Var1 = p_Var1 + 5;
  __ptr = (MultiPartInputFile *)p_Var1->_vptr__Sp_counted_base;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)this_00;
  if (__ptr != (MultiPartInputFile *)0x0) {
    std::default_delete<Imf_3_4::MultiPartInputFile>::operator()
              ((default_delete<Imf_3_4::MultiPartInputFile> *)p_Var1,__ptr);
  }
  pIVar2 = MultiPartInputFile::getPart
                     ((MultiPartInputFile *)
                      (((this->_data).
                        super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->_mFile)._M_t.
                      super___uniq_ptr_impl<Imf_3_4::MultiPartInputFile,_std::default_delete<Imf_3_4::MultiPartInputFile>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Imf_3_4::MultiPartInputFile_*,_std::default_delete<Imf_3_4::MultiPartInputFile>_>
                      .super__Head_base<0UL,_Imf_3_4::MultiPartInputFile_*,_false>,0);
  ((this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _part = pIVar2;
  (this->_ctxt)._ctxt.super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pIVar2->context)._ctxt.super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_ctxt)._ctxt.
              super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(pIVar2->context)._ctxt.
              super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  initialize(this);
  return;
}

Assistant:

InputFile::InputFile (
    const char* filename, const ContextInitializer& ctxtinit, int numThreads)
    : _data (std::make_shared<Data> (&_ctxt, numThreads))
{
    _data->_mFile.reset (new MultiPartInputFile (filename, ctxtinit, numThreads, false));
    _data->_part = _data->_mFile->getPart (Data::kDefaultPart);
    _ctxt = _data->_part->context;

    initialize ();
}